

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ast.cpp
# Opt level: O2

void __thiscall PrintAST::visit(PrintAST *this,VarStmtNode *node)

{
  VarDeclNode *pVVar1;
  StmtListNode *pSVar2;
  
  printAST(this,"VAR_STMT");
  this->level = this->level + 1;
  pVVar1 = node->dec;
  if (pVVar1 != (VarDeclNode *)0x0) {
    (*(pVVar1->super_ASTNode)._vptr_ASTNode[3])(pVVar1,this);
  }
  pSVar2 = node->body;
  if (pSVar2 != (StmtListNode *)0x0) {
    (*(pSVar2->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pSVar2,this);
  }
  this->level = this->level - 1;
  return;
}

Assistant:

void PrintAST::visit(VarStmtNode *node) {
    this->printAST("VAR_STMT");
    up_level();
    if (node->getDecl() != nullptr) {
        node->getDecl()->accept(this);
    }
    if (node->getBody() != nullptr) {
        node->getBody()->accept(this);
    }
    down_level();
}